

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camgeom.cc
# Opt level: O0

void gmath::refineOptimal(Matrix34d *RT1,Vector3d *p0,Vector3d *p1)

{
  ulong uVar1;
  value_type vVar2;
  double dVar3;
  double *pdVar4;
  size_type sVar5;
  reference pvVar6;
  SVector<double,_3> *in_RDX;
  SVector<double,_3> *in_RSI;
  Polynomiald *p_00;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double s;
  size_t i;
  double mins;
  double t;
  vector<double,_std::allocator<double>_> r;
  Polynomiald p;
  double d2;
  double c2;
  double b2;
  double a2;
  double g2;
  double f4;
  double f2;
  double d;
  double c;
  double b;
  double a;
  double g;
  double f;
  Matrix33d R1;
  Matrix33d R0;
  Vector3d e0;
  Vector3d e1;
  Matrix33d invT1;
  Matrix33d invT0;
  Matrix33d F;
  Vector3d T;
  Matrix33d R;
  Polynomial<double> *in_stack_fffffffffffff6c0;
  SVector<double,_3> *in_stack_fffffffffffff6c8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff6d0;
  SMatrix<double,_3,_4> *in_stack_fffffffffffff6d8;
  Polynomial<double> *in_stack_fffffffffffff6e0;
  SMatrix<double,_3,_3> *in_stack_fffffffffffff6e8;
  Vector3d *in_stack_fffffffffffff710;
  Matrix33d *in_stack_fffffffffffff718;
  SVector<double,_3> local_5a0 [7];
  SVector<double,_3> local_4f8;
  double local_4e0;
  ulong local_4d8;
  double local_4d0;
  value_type local_4c8;
  vector<double,_std::allocator<double>_> local_4c0 [2];
  double local_488;
  double local_480;
  double local_478;
  double local_470;
  double local_468;
  double local_460;
  double local_458;
  double local_450;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  double local_428;
  SMatrix<double,_3,_3> local_390;
  SMatrix<double,_3,_3> local_348;
  SMatrix<double,_3,_3> local_300 [2];
  SVector<double,_3> local_258;
  SVector<double,_3> local_240 [7];
  SMatrix<double,_3,_3> local_198;
  SMatrix<double,_3,_3> local_150;
  SMatrix<double,_3,_3> local_108;
  SMatrix<double,_3,_3> local_c0 [2];
  SVector<double,_3> *local_18;
  SVector<double,_3> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  getRotation(in_stack_fffffffffffff6d8);
  SMatrix<double,_3,_4>::getColumn
            (in_stack_fffffffffffff6d8,(int)((ulong)in_stack_fffffffffffff6d0 >> 0x20));
  createEssential(in_stack_fffffffffffff718,in_stack_fffffffffffff710);
  SMatrix<double,_3,_3>::SMatrix(&local_108);
  SMatrix<double,_3,_3>::SMatrix(&local_150);
  pdVar4 = SVector<double,_3>::operator[](local_10,0);
  dVar7 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_10,2);
  dVar12 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(&local_108,0,2);
  *pdVar4 = dVar7 / dVar12;
  pdVar4 = SVector<double,_3>::operator[](local_10,1);
  dVar7 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_10,2);
  p_00 = (Polynomiald *)(dVar7 / *pdVar4);
  pdVar4 = SMatrix<double,_3,_3>::operator()(&local_108,1,2);
  *pdVar4 = (double)p_00;
  pdVar4 = SVector<double,_3>::operator[](local_18,0);
  dVar7 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_18,2);
  dVar12 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(&local_150,0,2);
  *pdVar4 = dVar7 / dVar12;
  pdVar4 = SVector<double,_3>::operator[](local_18,1);
  dVar7 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_18,2);
  dVar12 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(&local_150,1,2);
  *pdVar4 = dVar7 / dVar12;
  transpose<double,3,3>((SMatrix<double,_3,_3> *)in_stack_fffffffffffff6d8);
  operator*(in_stack_fffffffffffff6e8,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff6e0);
  operator*(in_stack_fffffffffffff6e8,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff6e0);
  SMatrix<double,_3,_3>::operator=(local_c0,&local_198);
  SVector<double,_3>::SVector
            ((SVector<double,_3> *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  transpose<double,3,3>((SMatrix<double,_3,_3> *)in_stack_fffffffffffff6d8);
  SVector<double,_3>::operator-((SVector<double,_3> *)in_stack_fffffffffffff6d8);
  SMatrix<double,_3,_3>::operator*
            (in_stack_fffffffffffff6e8,(SVector<double,_3> *)in_stack_fffffffffffff6e0);
  pdVar4 = SVector<double,_3>::operator[](&local_258,2);
  SVector<double,_3>::operator/=(&local_258,*pdVar4);
  pdVar4 = SVector<double,_3>::operator[](local_240,2);
  SVector<double,_3>::operator/=(local_240,*pdVar4);
  pdVar4 = SVector<double,_3>::operator[](local_10,0);
  dVar7 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_10,2);
  dVar12 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](&local_258,0);
  *pdVar4 = *pdVar4 - dVar7 / dVar12;
  pdVar4 = SVector<double,_3>::operator[](local_10,1);
  dVar7 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_10,2);
  dVar12 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](&local_258,1);
  *pdVar4 = *pdVar4 - dVar7 / dVar12;
  pdVar4 = SVector<double,_3>::operator[](local_18,0);
  dVar7 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_18,2);
  dVar12 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_240,0);
  *pdVar4 = *pdVar4 - dVar7 / dVar12;
  pdVar4 = SVector<double,_3>::operator[](local_18,1);
  dVar7 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_18,2);
  dVar12 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_240,1);
  *pdVar4 = *pdVar4 - dVar7 / dVar12;
  pdVar4 = SVector<double,_3>::operator[](&local_258,0);
  dVar7 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](&local_258,0);
  dVar12 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](&local_258,1);
  dVar8 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](&local_258,1);
  dVar7 = sqrt(dVar7 * dVar12 + dVar8 * *pdVar4);
  SVector<double,_3>::operator/=(&local_258,dVar7);
  pdVar4 = SVector<double,_3>::operator[](local_240,0);
  dVar7 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_240,0);
  dVar12 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_240,1);
  dVar8 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_240,1);
  dVar7 = sqrt(dVar7 * dVar12 + dVar8 * *pdVar4);
  SVector<double,_3>::operator/=(local_240,dVar7);
  SMatrix<double,_3,_3>::SMatrix(local_300);
  pdVar4 = SVector<double,_3>::operator[](&local_258,0);
  dVar7 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(local_300,0,0);
  *pdVar4 = dVar7;
  pdVar4 = SVector<double,_3>::operator[](&local_258,1);
  dVar7 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(local_300,0,1);
  *pdVar4 = dVar7;
  pdVar4 = SVector<double,_3>::operator[](&local_258,1);
  dVar7 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(local_300,1,0);
  *pdVar4 = -dVar7;
  pdVar4 = SVector<double,_3>::operator[](&local_258,0);
  dVar7 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(local_300,1,1);
  *pdVar4 = dVar7;
  pdVar4 = SMatrix<double,_3,_3>::operator()(local_300,2,2);
  *pdVar4 = 1.0;
  SMatrix<double,_3,_3>::SMatrix(&local_348);
  pdVar4 = SVector<double,_3>::operator[](local_240,0);
  dVar7 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(&local_348,0,0);
  *pdVar4 = dVar7;
  pdVar4 = SVector<double,_3>::operator[](local_240,1);
  dVar7 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(&local_348,0,1);
  *pdVar4 = dVar7;
  pdVar4 = SVector<double,_3>::operator[](local_240,1);
  dVar7 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(&local_348,1,0);
  *pdVar4 = -dVar7;
  pdVar4 = SVector<double,_3>::operator[](local_240,0);
  dVar7 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(&local_348,1,1);
  *pdVar4 = dVar7;
  pdVar4 = SMatrix<double,_3,_3>::operator()(&local_348,2,2);
  *pdVar4 = 1.0;
  operator*(in_stack_fffffffffffff6e8,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff6e0);
  transpose<double,3,3>((SMatrix<double,_3,_3> *)in_stack_fffffffffffff6d8);
  operator*(in_stack_fffffffffffff6e8,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff6e0);
  SMatrix<double,_3,_3>::operator=(local_c0,&local_390);
  pdVar4 = SVector<double,_3>::operator[](&local_258,2);
  local_428 = *pdVar4;
  pdVar4 = SVector<double,_3>::operator[](local_240,2);
  local_430 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(local_c0,1,1);
  local_438 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(local_c0,1,2);
  local_440 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(local_c0,2,1);
  local_448 = *pdVar4;
  pdVar4 = SMatrix<double,_3,_3>::operator()(local_c0,2,2);
  local_450 = *pdVar4;
  local_458 = local_428 * local_428;
  local_460 = local_458 * local_458;
  local_468 = local_430 * local_430;
  local_470 = local_438 * local_438;
  local_478 = local_440 * local_440;
  local_480 = local_448 * local_448;
  local_488 = local_450 * local_450;
  Polynomial<double>::Polynomial(in_stack_fffffffffffff6c0);
  Polynomial<double>::set
            (in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
             (double)in_stack_fffffffffffff6d0);
  Polynomial<double>::set
            (in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
             (double)in_stack_fffffffffffff6d0);
  Polynomial<double>::set
            (in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
             (double)in_stack_fffffffffffff6d0);
  Polynomial<double>::set
            (in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
             (double)in_stack_fffffffffffff6d0);
  Polynomial<double>::set
            (in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
             (double)in_stack_fffffffffffff6d0);
  Polynomial<double>::set
            (in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
             (double)in_stack_fffffffffffff6d0);
  Polynomial<double>::set
            (in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
             (double)in_stack_fffffffffffff6d0);
  realRoots(p_00);
  local_4c8 = std::numeric_limits<double>::max();
  local_4d0 = std::numeric_limits<double>::max();
  for (local_4d8 = 0; uVar1 = local_4d8,
      sVar5 = std::vector<double,_std::allocator<double>_>::size(local_4c0), dVar12 = local_428,
      dVar7 = local_438, uVar1 < sVar5; local_4d8 = local_4d8 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_4c0,local_4d8);
    dVar12 = local_438;
    dVar8 = dVar7 * *pvVar6 + local_440;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_4c0,local_4d8);
    dVar7 = local_448;
    dVar9 = dVar12 * *pvVar6 + local_440;
    dVar10 = local_430 * local_430;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_4c0,local_4d8);
    dVar12 = local_448;
    dVar7 = dVar7 * *pvVar6 + local_450;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_4c0,local_4d8);
    local_4e0 = dVar8 * dVar9 + dVar10 * dVar7 * (dVar12 * *pvVar6 + local_450);
    if ((local_4e0 != 0.0) || (NAN(local_4e0))) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_4c0,local_4d8);
      dVar7 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_4c0,local_4d8);
      dVar12 = *pvVar6;
      dVar11 = local_428 * local_428;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_4c0,local_4d8);
      dVar8 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_4c0,local_4d8);
      dVar10 = local_448;
      dVar9 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_4c0,local_4d8);
      dVar3 = local_448;
      dVar10 = dVar10 * *pvVar6 + local_450;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_4c0,local_4d8);
      local_4e0 = (dVar7 * dVar12) / (dVar11 * dVar8 * dVar9 + 1.0) +
                  (dVar10 * (dVar3 * *pvVar6 + local_450)) / local_4e0;
      if (local_4e0 < local_4d0) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_4c0,local_4d8);
        local_4c8 = *pvVar6;
        local_4d0 = local_4e0;
      }
    }
  }
  if (((local_428 * local_428 <= 0.0) ||
      (local_438 * local_438 + local_430 * local_430 * local_448 * local_448 <= 0.0)) ||
     (local_4d0 <=
      1.0 / (local_428 * local_428) +
      (local_448 * local_448) /
      (local_438 * local_438 + local_430 * local_430 * local_448 * local_448))) {
    dVar7 = local_4c8 * local_4c8 * local_428;
    pdVar4 = SVector<double,_3>::operator[](local_10,0);
    vVar2 = local_4c8;
    *pdVar4 = dVar7;
    pdVar4 = SVector<double,_3>::operator[](local_10,1);
    *pdVar4 = vVar2;
    dVar7 = local_4c8 * local_4c8 * local_458;
    pdVar4 = SVector<double,_3>::operator[](local_10,2);
    *pdVar4 = dVar7 + 1.0;
    dVar7 = local_448 * local_4c8 + local_450;
    in_stack_fffffffffffff6e0 = (Polynomial<double> *)(local_430 * dVar7 * dVar7);
    in_stack_fffffffffffff6e8 = (SMatrix<double,_3,_3> *)SVector<double,_3>::operator[](local_18,0);
    in_stack_fffffffffffff6e8->v[0][0] = (double)in_stack_fffffffffffff6e0;
    in_stack_fffffffffffff6d0 =
         (vector<double,_std::allocator<double>_> *)
         (-(local_438 * local_4c8 + local_440) * (local_448 * local_4c8 + local_450));
    in_stack_fffffffffffff6d8 = (SMatrix<double,_3,_4> *)SVector<double,_3>::operator[](local_18,1);
    in_stack_fffffffffffff6d8->v[0][0] = (double)in_stack_fffffffffffff6d0;
    dVar12 = local_448 * local_4c8 + local_450;
    dVar7 = local_438 * local_4c8 + local_440;
    in_stack_fffffffffffff6c0 = (Polynomial<double> *)(local_468 * dVar12 * dVar12 + dVar7 * dVar7);
    pdVar4 = SVector<double,_3>::operator[](local_18,2);
    *pdVar4 = (double)in_stack_fffffffffffff6c0;
  }
  else {
    pdVar4 = SVector<double,_3>::operator[](local_10,0);
    *pdVar4 = dVar12;
    pdVar4 = SVector<double,_3>::operator[](local_10,1);
    dVar7 = local_458;
    *pdVar4 = 0.0;
    pdVar4 = SVector<double,_3>::operator[](local_10,2);
    *pdVar4 = dVar7;
    dVar7 = local_430 * local_480;
    pdVar4 = SVector<double,_3>::operator[](local_18,0);
    *pdVar4 = dVar7;
    dVar7 = -local_438 * local_448;
    pdVar4 = SVector<double,_3>::operator[](local_18,1);
    *pdVar4 = dVar7;
    dVar7 = local_468 * local_480 + local_470;
    pdVar4 = SVector<double,_3>::operator[](local_18,2);
    *pdVar4 = dVar7;
  }
  transpose<double,3,3>((SMatrix<double,_3,_3> *)in_stack_fffffffffffff6d8);
  operator*(in_stack_fffffffffffff6e8,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff6e0);
  SMatrix<double,_3,_3>::operator*
            (in_stack_fffffffffffff6e8,(SVector<double,_3> *)in_stack_fffffffffffff6e0);
  SVector<double,_3>::operator=(local_10,&local_4f8);
  transpose<double,3,3>((SMatrix<double,_3,_3> *)in_stack_fffffffffffff6d8);
  operator*(in_stack_fffffffffffff6e8,(SMatrix<double,_3,_3> *)in_stack_fffffffffffff6e0);
  SMatrix<double,_3,_3>::operator*
            (in_stack_fffffffffffff6e8,(SVector<double,_3> *)in_stack_fffffffffffff6e0);
  SVector<double,_3>::operator=(local_18,local_5a0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff6d0);
  Polynomial<double>::~Polynomial(in_stack_fffffffffffff6c0);
  return;
}

Assistant:

void refineOptimal(const Matrix34d &RT1, Vector3d &p0, Vector3d &p1)
{
  const Matrix33d R=getRotation(RT1);
  const Vector3d T=RT1.getColumn(3);
  Matrix33d F=createEssential(R, T);

  // the implementation follows Hartley and Zisserman's (2003, pp. 318)

  Matrix33d invT0;
  Matrix33d invT1;
  invT0(0, 2)=p0[0]/p0[2];
  invT0(1, 2)=p0[1]/p0[2];
  invT1(0, 2)=p1[0]/p1[2];
  invT1(1, 2)=p1[1]/p1[2];

  // transform F

  F=transpose(invT1)*F*invT0;

  // get epipoles that correspond to new fundamental matrix

  Vector3d e1=T;
  Vector3d e0=transpose(R)*-T;

  e0/=e0[2];
  e1/=e1[2];
  e0[0]-=p0[0]/p0[2];
  e0[1]-=p0[1]/p0[2];
  e1[0]-=p1[0]/p1[2];
  e1[1]-=p1[1]/p1[2];

  // compute rotations

  e0/=sqrt(e0[0]*e0[0]+e0[1]*e0[1]);
  e1/=sqrt(e1[0]*e1[0]+e1[1]*e1[1]);

  Matrix33d R0;
  R0(0, 0)=e0[0];
  R0(0, 1)=e0[1];
  R0(1, 0)=-e0[1];
  R0(1, 1)=e0[0];
  R0(2, 2)=1;

  Matrix33d R1;
  R1(0, 0)=e1[0];
  R1(0, 1)=e1[1];
  R1(1, 0)=-e1[1];
  R1(1, 1)=e1[0];
  R1(2, 2)=1;

  // compute new F

  F=R1*F*transpose(R0);

  // compute coefficients of polynomial

  const double f=e0[2];
  const double g=e1[2];
  const double a=F(1, 1);
  const double b=F(1, 2);
  const double c=F(2, 1);
  const double d=F(2, 2);
  const double f2=f*f;
  const double f4=f2*f2;
  const double g2=g*g;
  const double a2=a*a;
  const double b2=b*b;
  const double c2=c*c;
  const double d2=d*d;

  Polynomiald p;
  p.set(0, b2*c*d-a*b*d2);
  p.set(1, b2*b2+b2*c2-a2*d2+2*b2*d2*g2+d2*d2*g2*g2);
  p.set(2, 4*a*b2*b+a*b*c2-a2*c*d+2*b2*c*d*f2-2*a*b*d2*f2+4*b2*c*d*g2+4*a*b*d2*g2
        +4*c*d2*d*g2*g2);
  p.set(3, 6*a2*b2+2*b2*c2*f2-2*a2*d2*f2+2*b2*c2*g2+8*a*b*c*d*g2+2*a2*d2*g2
        +6*c2*d2*g2*g2);
  p.set(4, 4*a2*a*b+2*a*b*c2*f2-2*a2*c*d*f2+b2*c*d*f4-a*b*d2*f4+4*a*b*c2*g2
        +4*a2*c*d*g2+4*c2*c*d*g2*g2);
  p.set(5, a2*a2+b2*c2*f4-a2*d2*f4+2*a2*c2*g2+c2*c2*g2*g2);
  p.set(6, a*b*c2*f4-a2*c*d*f4);

  // setting polynomial to 0 and get all real roots

  std::vector<double> r=realRoots(p);

  // find global minima (solution is t)

  double t=std::numeric_limits<double>::max();
  double mins=std::numeric_limits<double>::max();

  for (size_t i=0; i<r.size(); i++)
  {
    double s=(a*r[i]+b)*(a*r[i]+b)+g*g*(c*r[i]+d)*(c*r[i]+d);

    if (s != 0)
    {
      s=r[i]*r[i]/(1+f*f*r[i]*r[i])+(c*r[i]+d)*(c*r[i]+d)/s;

      if (s < mins)
      {
        t=r[i];
        mins=s;
      }
    }
  }

  // get optimal corner positions

  if (f*f > 0 && a*a+g*g*c*c > 0 && 1/(f*f)+c*c/(a*a+g*g*c*c) < mins)
  {
    p0[0]=f;
    p0[1]=0;
    p0[2]=f2;
    p1[0]=g*c2;
    p1[1]=-a*c;
    p1[2]=g2*c2+a2;
  }
  else
  {
    p0[0]=t*t*f;
    p0[1]=t;
    p0[2]=t*t*f2+1;
    p1[0]=g*(c*t+d)*(c*t+d);
    p1[1]=-(a*t+b)*(c*t+d);
    p1[2]=g2*(c*t+d)*(c*t+d)+(a*t+b)*(a*t+b);
  }

  // transform refined points back

  p0=invT0*transpose(R0)*p0;
  p1=invT1*transpose(R1)*p1;
}